

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

void try_initialize_global_cpu_info(void)

{
  int *piVar1;
  __cpu_mask *p_Var2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  FILE *pFVar6;
  char *pcVar7;
  CpuSet *pCVar8;
  ulong uVar9;
  long lVar10;
  int i;
  int iVar11;
  int iVar12;
  uint __max_leaf;
  CpuSet *pCVar13;
  int i_1;
  ulong uVar14;
  bool bVar15;
  byte bVar16;
  uint in_XCR0;
  int freq_khz;
  int local_458;
  int local_454;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  vector<int,_std::allocator<int>_> thread_set;
  
  bVar16 = 0;
  if (g_cpu_info_initialized == '\0') {
    pFVar6 = fopen("/proc/cpuinfo","rb");
    if (pFVar6 == (FILE *)0x0) {
      g_cpucount = 1;
    }
    else {
      iVar11 = 0;
      while ((iVar4 = feof(pFVar6), iVar4 == 0 &&
             (pcVar7 = fgets((char *)&thread_set,0x400,pFVar6), pcVar7 != (char *)0x0))) {
        iVar4 = bcmp(&thread_set,"processor",9);
        iVar11 = iVar11 + (uint)(iVar4 == 0);
      }
      fclose(pFVar6);
      g_cpucount = 1;
      if (1 < iVar11) {
        g_cpucount = iVar11;
      }
    }
    thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar4 = 0;
    for (iVar11 = 0; iVar11 < g_cpucount; iVar11 = iVar11 + 1) {
      cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start._0_4_ = get_thread_siblings(iVar11);
      if ((int)cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != -1) {
        lVar10 = 0;
        do {
          if ((long)thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 == lVar10) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (&thread_set,(value_type_conflict3 *)&cpu_max_freq_khz);
            iVar4 = iVar4 + 1;
            break;
          }
          piVar1 = thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar10;
          lVar10 = lVar10 + 1;
        } while (*piVar1 !=
                 (int)cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      }
    }
    iVar11 = g_cpucount;
    if (iVar4 < g_cpucount) {
      iVar11 = iVar4;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&thread_set.super__Vector_base<int,_std::allocator<int>_>);
    g_powersave = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[1] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[2] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[3] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[4] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[5] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[6] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[7] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[8] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[9] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[10] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xb] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xc] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xd] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xe] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xf] = 0;
    g_physical_cpucount = iVar11;
    std::vector<int,_std::allocator<int>_>::vector
              (&cpu_max_freq_khz,(long)g_cpucount,(allocator_type *)&thread_set);
    iVar11 = 0x7fffffff;
    uVar14 = 0;
    iVar4 = 0;
    while( true ) {
      uVar9 = (ulong)g_cpucount;
      if ((long)uVar9 <= (long)uVar14) break;
      local_458 = iVar4;
      local_454 = iVar11;
      sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state",
              uVar14 & 0xffffffff);
      pFVar6 = fopen((char *)&thread_set,"rb");
      if (pFVar6 == (FILE *)0x0) {
        sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state",
                uVar14 & 0xffffffff);
        pFVar6 = fopen((char *)&thread_set,"rb");
        if (pFVar6 != (FILE *)0x0) {
          iVar11 = 0;
          do {
            iVar12 = iVar11;
            iVar11 = feof(pFVar6);
            if (iVar11 != 0) break;
            freq_khz = 0;
            iVar4 = __isoc99_fscanf(pFVar6,"%d %*d",&freq_khz);
            iVar11 = freq_khz;
            if (freq_khz <= iVar12) {
              iVar11 = iVar12;
            }
          } while (iVar4 == 1);
          fclose(pFVar6);
          if (iVar12 != 0) goto LAB_0016fb26;
        }
        sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq",
                uVar14 & 0xffffffff);
        pFVar6 = fopen((char *)&thread_set,"rb");
        iVar12 = -1;
        if (pFVar6 != (FILE *)0x0) {
          freq_khz = -1;
          uVar5 = __isoc99_fscanf(pFVar6,"%d",&freq_khz);
          if (uVar5 != 1) {
            fprintf(_stderr,"fscanf cpuinfo_max_freq error %d",(ulong)uVar5);
            fputc(10,_stderr);
          }
          fclose(pFVar6);
          iVar12 = freq_khz;
        }
      }
      else {
        iVar11 = 0;
        do {
          iVar12 = iVar11;
          iVar11 = feof(pFVar6);
          if (iVar11 != 0) break;
          freq_khz = 0;
          iVar4 = __isoc99_fscanf(pFVar6,"%d %*d",&freq_khz);
          iVar11 = freq_khz;
          if (freq_khz <= iVar12) {
            iVar11 = iVar12;
          }
        } while (iVar4 == 1);
        fclose(pFVar6);
      }
LAB_0016fb26:
      *(int *)(CONCAT44(cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) + uVar14 * 4) = iVar12;
      iVar4 = local_458;
      if (local_458 < iVar12) {
        iVar4 = iVar12;
      }
      iVar11 = local_454;
      if (iVar12 < local_454) {
        iVar11 = iVar12;
      }
      uVar14 = uVar14 + 1;
    }
    iVar11 = (iVar11 + iVar4) / 2;
    if (iVar11 == iVar4) {
      g_cpu_affinity_mask_little.cpu_set.__bits[0xe] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0xf] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0xc] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0xd] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[10] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0xb] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[8] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[9] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[6] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[7] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[4] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[5] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[2] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[3] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[1] = 0;
      pCVar8 = &g_cpu_affinity_mask_all;
      pCVar13 = &g_cpu_affinity_mask_big;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pCVar13->cpu_set).__bits[0] = (pCVar8->cpu_set).__bits[0];
        pCVar8 = (CpuSet *)((long)pCVar8 + ((ulong)bVar16 * -2 + 1) * 8);
        pCVar13 = (CpuSet *)((long)pCVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      }
    }
    else {
      for (uVar14 = 0; (long)uVar14 < (long)(int)uVar9; uVar14 = uVar14 + 1) {
        sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpu%d/topology/core_cpus_list",
                uVar14 & 0xffffffff);
        pFVar6 = fopen((char *)&thread_set,"rb");
        if (pFVar6 == (FILE *)0x0) {
          sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list",
                  uVar14 & 0xffffffff);
          pFVar6 = fopen((char *)&thread_set,"rb");
          if (pFVar6 != (FILE *)0x0) goto LAB_0016fda8;
LAB_0016fde4:
          pCVar8 = &g_cpu_affinity_mask_big;
          if (*(int *)(CONCAT44(cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start) + uVar14 * 4) <
              iVar11) {
            pCVar8 = &g_cpu_affinity_mask_little;
          }
        }
        else {
LAB_0016fda8:
          do {
            iVar4 = feof(pFVar6);
            if (iVar4 != 0) {
              fclose(pFVar6);
              goto LAB_0016fde4;
            }
            uVar5 = fgetc(pFVar6);
          } while ((uVar5 & 0xfe) != 0x2c);
          fclose(pFVar6);
          pCVar8 = &g_cpu_affinity_mask_big;
        }
        if (uVar14 < 0x400) {
          p_Var2 = (pCVar8->cpu_set).__bits + (uVar14 >> 6);
          *p_Var2 = *p_Var2 | 1L << ((byte)uVar14 & 0x3f);
        }
        uVar9 = (ulong)(uint)g_cpucount;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>);
    g_hwcaps = get_elf_hwcap(0x10);
    get_elf_hwcap(0x1a);
    g_cpu_support_x86_fma = 0;
    puVar3 = (uint *)cpuid_basic_info(0);
    uVar5 = *puVar3;
    if ((int)uVar5 < 1) {
      g_cpu_support_x86_avx = 0;
      bVar15 = true;
    }
    else {
      lVar10 = cpuid_Version_info(1);
      if ((~*(uint *)(lVar10 + 0xc) & 0x1c000000) == 0) {
        g_cpu_support_x86_fma = 0;
        g_cpu_support_x86_avx = (int)((in_XCR0 & 6) == 6);
        bVar15 = true;
        if (6 < uVar5) {
          g_cpu_support_x86_fma = *(uint *)(lVar10 + 0xc) & 0x1000;
          bVar15 = false;
          if ((in_XCR0 & 6) != 6) {
            g_cpu_support_x86_fma = 0;
          }
        }
      }
      else {
        g_cpu_support_x86_avx = 0;
        bVar15 = uVar5 < 7;
        g_cpu_support_x86_fma = 0;
      }
    }
    puVar3 = (uint *)cpuid(0x80000000);
    g_cpu_support_x86_f16c = 0;
    g_cpu_support_x86_xop = 0;
    if (0x80000000 < *puVar3) {
      lVar10 = cpuid(0x80000001);
      g_cpu_support_x86_xop = *(uint *)(lVar10 + 0xc) & 0x800;
    }
    if (0 < (int)uVar5) {
      lVar10 = cpuid_Version_info(1);
      g_cpu_support_x86_f16c = *(uint *)(lVar10 + 0xc) & 0x20000000;
    }
    if ((bVar15) || (lVar10 = cpuid_Version_info(1), (~*(uint *)(lVar10 + 0xc) & 0x1c000000) != 0))
    {
      g_cpu_support_x86_avx2 = 0;
      g_cpu_support_x86_avx_vnni = 0;
      g_cpu_support_x86_avx512 = 0;
      g_cpu_support_x86_avx512_vnni = 0;
      g_cpu_support_x86_avx512_bf16 = 0;
      g_cpu_support_x86_avx512_fp16 = 0;
    }
    else {
      g_cpu_support_x86_avx512 = 0;
      g_cpu_support_x86_avx2 = 0;
      g_cpu_support_x86_avx_vnni = 0;
      if ((in_XCR0 & 6) == 6) {
        lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx2 = *(uint *)(lVar10 + 4) & 0x20;
        puVar3 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx_vnni = *puVar3 & 0x10;
      }
      g_cpu_support_x86_avx512_vnni = 0;
      if ((in_XCR0 & 0xe6) == 0xe6) {
        lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512 = *(uint *)(lVar10 + 4) >> 0x1f;
        if ((~*(uint *)(lVar10 + 4) & 0x50030000) != 0) {
          g_cpu_support_x86_avx512 = 0;
        }
        g_cpu_support_x86_avx512_vnni = *(uint *)(lVar10 + 0xc) & 0x800;
      }
      g_cpu_support_x86_avx512_fp16 = 0;
      g_cpu_support_x86_avx512_bf16 = 0;
      if ((in_XCR0 & 6) == 6) {
        puVar3 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512_bf16 = *puVar3 & 0x20;
      }
      if ((in_XCR0 & 0xe6) == 0xe6) {
        lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512_fp16 = *(uint *)(lVar10 + 8) & 0x800000;
      }
    }
    iVar11 = get_big_cpu_data_cache_size(2);
    if (iVar11 < 1) {
      lVar10 = sysconf(0xbf);
      iVar11 = (int)lVar10;
      if ((int)lVar10 < 1) {
        iVar4 = 0x40000;
        if (g_cpu_support_x86_avx2 == 0) {
          iVar4 = (uint)(g_cpu_support_x86_avx != 0) * 0x10000 + 0x10000;
        }
        iVar11 = 0x100000;
        if (g_cpu_support_x86_avx512 == 0) {
          iVar11 = iVar4;
        }
      }
    }
    g_cpu_level2_cachesize = iVar11;
    iVar11 = get_big_cpu_data_cache_size(3);
    if (iVar11 < 1) {
      lVar10 = sysconf(0xc2);
      iVar11 = (int)lVar10;
    }
    g_cpu_info_initialized = '\x01';
    g_cpu_level3_cachesize = iVar11;
  }
  return;
}

Assistant:

static inline void try_initialize_global_cpu_info()
{
    if (!g_cpu_info_initialized)
    {
        initialize_global_cpu_info();
        g_cpu_info_initialized = 1;
    }
}